

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O3

void oonf_timer_walk(void)

{
  int *piVar1;
  list_entity *plVar2;
  list_entity *timer;
  int iVar3;
  list_entity *plVar4;
  uint64_t end_time;
  uint64_t start_time;
  
  if (_timer_tree.count != 0) {
    do {
      timer = _timer_tree.list_head.next;
      plVar2 = _timer_tree.list_head.next[5].prev;
      plVar4 = (list_entity *)oonf_clock_getNow();
      if (plVar4 < plVar2) {
        return;
      }
      if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 1) != 0) {
        oonf_log(1,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x104,0,0,
                 "TIMER: fire \'%s\' at clocktick %lu\n",timer[3].prev[1].next,timer[5].prev);
      }
      plVar2 = timer[3].prev;
      plVar2[3].prev = timer;
      *(undefined1 *)&plVar2[4].next = 0;
      piVar1 = (int *)((long)&plVar2[2].prev + 4);
      *piVar1 = *piVar1 + 1;
      if (timer[4].prev == (list_entity *)0x0) {
        oonf_timer_stop((oonf_timer_instance *)timer);
      }
      os_clock_linux_gettime64(&start_time);
      (*(code *)timer[3].prev[1].prev)(timer);
      os_clock_linux_gettime64(&end_time);
      if (100 < end_time - start_time) {
        if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
          oonf_log(4,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x11b,0,0,
                   "Timer %s scheduling took %lu ms",timer[3].prev[1].next,end_time - start_time);
        }
        *(int *)&plVar2[3].next = *(int *)&plVar2[3].next + 1;
      }
      if (*(char *)&plVar2[4].next == '\0') {
        iVar3 = os_core_linux_get_random(timer + 5,4);
        if (iVar3 != 0) {
          if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
            oonf_log(4,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x129,0,0,
                     "Could not get random data");
          }
          *(undefined4 *)&timer[5].next = 0;
        }
        oonf_timer_start_ext
                  ((oonf_timer_instance *)timer,(uint64_t)timer[4].prev,(uint64_t)timer[4].prev);
      }
    } while (_timer_tree.count != 0);
  }
  return;
}

Assistant:

static INLINE bool
avl_is_empty(const struct avl_tree *tree) {
  return tree->count == 0;
}